

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O3

SinkCombineResultType __thiscall
duckdb::PhysicalPiecewiseMergeJoin::Combine
          (PhysicalPiecewiseMergeJoin *this,ExecutionContext *context,
          OperatorSinkCombineInput *input)

{
  LocalSinkState *pLVar1;
  pointer pGVar2;
  QueryProfiler *this_00;
  
  pLVar1 = input->local_state;
  pGVar2 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
           ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                         *)(input->global_state + 1));
  GlobalSortState::AddLocalState
            (&pGVar2->global_sort_state,(LocalSortState *)&pLVar1[1].partition_info);
  LOCK();
  (pGVar2->has_null).super___atomic_base<unsigned_long>._M_i =
       (pGVar2->has_null).super___atomic_base<unsigned_long>._M_i +
       pLVar1[8].partition_info.min_batch_index.index;
  UNLOCK();
  LOCK();
  (pGVar2->count).super___atomic_base<unsigned_long>._M_i =
       (long)&((pLVar1[8].partition_info.partition_data.
                super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                .
                super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                ._M_impl.super__Vector_impl_data._M_start)->min_val).type_ +
       (pGVar2->count).super___atomic_base<unsigned_long>._M_i;
  UNLOCK();
  this_00 = QueryProfiler::Get(context->client);
  OperatorProfiler::Flush(&context->thread->profiler,(PhysicalOperator *)this);
  QueryProfiler::Flush(this_00,&context->thread->profiler);
  return FINISHED;
}

Assistant:

SinkCombineResultType PhysicalPiecewiseMergeJoin::Combine(ExecutionContext &context,
                                                          OperatorSinkCombineInput &input) const {
	auto &gstate = input.global_state.Cast<MergeJoinGlobalState>();
	auto &lstate = input.local_state.Cast<MergeJoinLocalState>();
	gstate.table->Combine(lstate.table);
	auto &client_profiler = QueryProfiler::Get(context.client);

	context.thread.profiler.Flush(*this);
	client_profiler.Flush(context.thread.profiler);

	return SinkCombineResultType::FINISHED;
}